

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

void __thiscall LexerTest_LexHexInt_Test::TestBody(LexerTest_LexHexInt_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  optional<unsigned_long> oVar3;
  string local_25d0;
  AssertHelper local_25b0;
  Message local_25a8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2598;
  string_view local_2570;
  Lexer local_2560;
  _Optional_payload_base<unsigned_int> local_2504;
  bool local_24f9;
  undefined1 local_24f8 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_24c8;
  Message local_24c0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_24b0;
  string_view local_2488;
  Lexer local_2478;
  _Optional_payload_base<unsigned_int> local_241c;
  bool local_2411;
  undefined1 local_2410 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_23e0;
  Message local_23d8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_23c8;
  string_view local_23a0;
  Lexer local_2390;
  _Optional_payload_base<unsigned_int> local_2334;
  bool local_2329;
  undefined1 local_2328 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_22f8;
  Message local_22f0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_22e0;
  string_view local_22b8;
  Lexer local_22a8;
  _Optional_payload_base<unsigned_int> local_224c;
  bool local_2241;
  undefined1 local_2240 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_2210;
  Message local_2208 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_21f8;
  string_view local_21d0;
  Lexer local_21c0;
  _Optional_payload_base<unsigned_int> local_2164;
  bool local_2159;
  undefined1 local_2158 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_2128;
  Message local_2120 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2110;
  string_view local_20e8;
  Lexer local_20d8;
  _Optional_payload_base<unsigned_int> local_207c;
  bool local_2071;
  undefined1 local_2070 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_2040;
  Message local_2038 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2028;
  string_view local_2000;
  Lexer local_1ff0;
  _Optional_payload_base<unsigned_int> local_1f94;
  bool local_1f89;
  undefined1 local_1f88 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_1f58;
  Message local_1f50 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f40;
  string_view local_1f18;
  Lexer local_1f08;
  _Optional_payload_base<unsigned_int> local_1eac;
  bool local_1ea1;
  undefined1 local_1ea0 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_1e70;
  Message local_1e68 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e58;
  string_view local_1e30;
  Lexer local_1e20;
  _Optional_payload_base<unsigned_int> local_1dc4;
  bool local_1db9;
  undefined1 local_1db8 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_1d88;
  Message local_1d80 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d70;
  string_view local_1d48;
  Lexer local_1d38;
  _Optional_payload_base<unsigned_int> local_1cdc;
  bool local_1cd1;
  undefined1 local_1cd0 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_1ca0;
  Message local_1c98 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c88;
  string_view local_1c60;
  Lexer local_1c50;
  _Optional_payload_base<unsigned_int> local_1bf4;
  bool local_1be9;
  undefined1 local_1be8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_1bb8;
  Message local_1bb0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1ba0;
  string_view local_1b78;
  Lexer local_1b68;
  _Optional_payload_base<unsigned_int> local_1b0c;
  bool local_1b01;
  undefined1 local_1b00 [8];
  AssertionResult gtest_ar__9;
  Message local_1ae8;
  uint local_1ae0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1ad8;
  string_view local_1ab0;
  Lexer local_1aa0;
  _Optional_payload_base<unsigned_int> local_1a48;
  undefined1 local_1a40 [8];
  AssertionResult gtest_ar_24;
  Message local_1a28;
  uint local_1a20 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a18;
  string_view local_19f0;
  Lexer local_19e0;
  _Optional_payload_base<unsigned_int> local_1988;
  undefined1 local_1980 [8];
  AssertionResult gtest_ar_23;
  Message local_1968;
  uint local_1960 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1958;
  string_view local_1930;
  Lexer local_1920;
  _Optional_payload_base<unsigned_int> local_18c8;
  undefined1 local_18c0 [8];
  AssertionResult gtest_ar_22;
  Message local_18a8;
  uint local_18a0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1898;
  string_view local_1870;
  Lexer local_1860;
  _Optional_payload_base<unsigned_int> local_1808;
  undefined1 local_1800 [8];
  AssertionResult gtest_ar_21;
  Message local_17e8;
  uint local_17e0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_17d8;
  string_view local_17b0;
  Lexer local_17a0;
  _Optional_payload_base<unsigned_int> local_1748;
  undefined1 local_1740 [8];
  AssertionResult gtest_ar_20;
  AssertHelper local_1710;
  Message local_1708 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_16f8;
  string_view local_16d0;
  Lexer local_16c0;
  _Optional_payload_base<unsigned_int> local_1664;
  bool local_1659;
  undefined1 local_1658 [8];
  AssertionResult gtest_ar__8;
  Message local_1640;
  uint local_1638 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1630;
  string_view local_1608;
  Lexer local_15f8;
  _Optional_payload_base<unsigned_int> local_15a0;
  undefined1 local_1598 [8];
  AssertionResult gtest_ar_19;
  AssertHelper local_1568;
  Message local_1560 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1550;
  string_view local_1528;
  Lexer local_1518;
  _Optional_payload_base<unsigned_int> local_14bc;
  bool local_14b1;
  undefined1 local_14b0 [8];
  AssertionResult gtest_ar__7;
  Message local_1498;
  uint local_1490 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1488;
  string_view local_1460;
  Lexer local_1450;
  _Optional_payload_base<unsigned_int> local_13f8;
  undefined1 local_13f0 [8];
  AssertionResult gtest_ar_18;
  Message local_13d8;
  uint local_13d0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_13c8;
  string_view local_13a0;
  Lexer local_1390;
  _Optional_payload_base<unsigned_int> local_1338;
  undefined1 local_1330 [8];
  AssertionResult gtest_ar_17;
  AssertHelper local_1300;
  Message local_12f8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_12e8;
  string_view local_12c0;
  Lexer local_12b0;
  _Optional_payload_base<unsigned_char> local_1253;
  bool local_1251;
  undefined1 local_1250 [8];
  AssertionResult gtest_ar__6;
  Message local_1238;
  uchar local_122a [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1228;
  string_view local_1200;
  Lexer local_11f0;
  _Optional_payload_base<unsigned_char> local_1192;
  undefined1 local_1190 [8];
  AssertionResult gtest_ar_16;
  AssertHelper local_1160;
  Message local_1158 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1148;
  string_view local_1120;
  Lexer local_1110;
  _Optional_payload_base<unsigned_char> local_10b3;
  bool local_10b1;
  undefined1 local_10b0 [8];
  AssertionResult gtest_ar__5;
  Message local_1098;
  uchar local_108a [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1088;
  string_view local_1060;
  Lexer local_1050;
  _Optional_payload_base<unsigned_char> local_ff2;
  undefined1 local_ff0 [8];
  AssertionResult gtest_ar_15;
  AssertHelper local_fc0;
  Message local_fb8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_fa8;
  string_view local_f80;
  Lexer local_f70;
  _Optional_payload_base<unsigned_char> local_f13;
  bool local_f11;
  undefined1 local_f10 [8];
  AssertionResult gtest_ar__4;
  Message local_ef8;
  uchar local_eea [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ee8;
  string_view local_ec0;
  Lexer local_eb0;
  _Optional_payload_base<unsigned_char> local_e52;
  undefined1 local_e50 [8];
  AssertionResult gtest_ar_14;
  Message local_e38;
  uchar local_e2a [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e28;
  string_view local_e00;
  Lexer local_df0;
  _Optional_payload_base<unsigned_char> local_d92;
  undefined1 local_d90 [8];
  AssertionResult gtest_ar_13;
  Message local_d78;
  uchar local_d6a [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d68;
  string_view local_d40;
  Lexer local_d30;
  _Optional_payload_base<unsigned_char> local_cd2;
  undefined1 local_cd0 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_ca0;
  Message local_c98 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c88;
  string_view local_c60;
  Lexer local_c50;
  _Optional_payload_base<unsigned_char> local_bf3;
  bool local_bf1;
  undefined1 local_bf0 [8];
  AssertionResult gtest_ar__3;
  Message local_bd8;
  uchar local_bca [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_bc8;
  string_view local_ba0;
  Lexer local_b90;
  _Optional_payload_base<unsigned_char> local_b32;
  undefined1 local_b30 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_b00;
  Message local_af8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ae8;
  string_view local_ac0;
  Lexer local_ab0;
  _Optional_payload_base<unsigned_char> local_a53;
  bool local_a51;
  undefined1 local_a50 [8];
  AssertionResult gtest_ar__2;
  Message local_a38;
  uchar local_a2a [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a28;
  string_view local_a00;
  Lexer local_9f0;
  _Optional_payload_base<unsigned_char> local_992;
  undefined1 local_990 [8];
  AssertionResult gtest_ar_10;
  Message local_978;
  uchar local_96a [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_968;
  string_view local_940;
  Lexer local_930;
  _Optional_payload_base<unsigned_char> local_8d2;
  undefined1 local_8d0 [8];
  AssertionResult gtest_ar_9;
  Message local_8b8;
  uchar local_8aa [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8a8;
  string_view local_880;
  Lexer local_870;
  _Optional_payload_base<unsigned_char> local_812;
  undefined1 local_810 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_7e0;
  Message local_7d8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7c8;
  string_view local_7a0;
  Lexer local_790;
  _Optional_payload_base<unsigned_char> local_733;
  bool local_731;
  undefined1 local_730 [8];
  AssertionResult gtest_ar__1;
  Message local_718;
  uchar local_70a [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_708;
  string_view local_6e0;
  Lexer local_6d0;
  _Optional_payload_base<unsigned_char> local_672;
  undefined1 local_670 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_640;
  Message local_638 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_628;
  string_view local_600;
  Lexer local_5f0;
  _Optional_payload_base<unsigned_char> local_593;
  bool local_591;
  undefined1 local_590 [8];
  AssertionResult gtest_ar_;
  Message local_578;
  unsigned_long local_570 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_560;
  string_view local_538;
  Lexer local_528;
  _Storage<unsigned_long,_true> local_4d0;
  undefined1 local_4c8;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_6;
  Message local_4a8;
  unsigned_long local_4a0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_490;
  string_view local_468;
  Lexer local_458;
  _Storage<unsigned_long,_true> local_400;
  undefined1 local_3f8;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_5;
  Message local_3d8;
  uint local_3d0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3c8;
  string_view local_3a0;
  Lexer local_390;
  _Optional_payload_base<unsigned_int> local_338;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_4;
  Message local_318;
  uint local_310 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  string_view local_2e0;
  Lexer local_2d0;
  _Optional_payload_base<unsigned_int> local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_3;
  Message local_258;
  unsigned_short local_24c [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  string_view local_220;
  Lexer local_210;
  _Optional_payload_base<unsigned_short> local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_2;
  Message local_198;
  uchar local_18a [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  string_view local_160;
  Lexer local_150;
  _Optional_payload_base<unsigned_char> local_f2;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_1;
  Message local_d8;
  uchar local_cd [21];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  string_view local_90;
  Lexer local_80;
  _Optional_payload_base<unsigned_char> local_22;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  LexerTest_LexHexInt_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_90 = sv("0x0",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_80,local_90,&local_b8);
  local_22 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_80);
  local_cd[0] = '\0';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_20,"Lexer(\"0x0\"sv).takeU8()","uint8_t(0)",
             (optional<unsigned_char> *)&local_22,local_cd);
  ::wasm::WATParser::Lexer::~Lexer(&local_80);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xb7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_160 = sv("0x0",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_150,local_160,&local_188);
  local_f2 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeI8(&local_150);
  local_18a[0] = '\0';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_f0,"Lexer(\"0x0\"sv).takeI8()","uint8_t(0)",
             (optional<unsigned_char> *)&local_f2,local_18a);
  ::wasm::WATParser::Lexer::~Lexer(&local_150);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xb8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_220 = sv("0x0",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_210,local_220,&local_248);
  local_1b4 = (_Optional_payload_base<unsigned_short>)::wasm::WATParser::Lexer::takeI16(&local_210);
  local_24c[0] = 0;
  testing::internal::EqHelper::Compare<std::optional<unsigned_short>,_unsigned_short,_nullptr>
            ((EqHelper *)local_1b0,"Lexer(\"0x0\"sv).takeI16()","uint16_t(0)",
             (optional<unsigned_short> *)&local_1b4,local_24c);
  ::wasm::WATParser::Lexer::~Lexer(&local_210);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xb9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  local_2e0 = sv("0x0",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2d0,local_2e0,&local_308);
  local_278 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_2d0);
  local_310[0] = 0;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_270,"Lexer(\"0x0\"sv).takeU32()","uint32_t(0)",
             (optional<unsigned_int> *)&local_278,local_310);
  ::wasm::WATParser::Lexer::~Lexer(&local_2d0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_308);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xba,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  local_3a0 = sv("0x0",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_390,local_3a0,&local_3c8);
  local_338 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_390);
  local_3d0[0] = 0;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_330,"Lexer(\"0x0\"sv).takeI32()","uint32_t(0)",
             (optional<unsigned_int> *)&local_338,local_3d0);
  ::wasm::WATParser::Lexer::~Lexer(&local_390);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_3c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xbb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  local_468 = sv("0x0",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_458,local_468,&local_490);
  oVar3 = ::wasm::WATParser::Lexer::takeU64(&local_458);
  local_400._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_3f8 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged;
  local_4a0[0] = 0;
  testing::internal::EqHelper::Compare<std::optional<unsigned_long>,_unsigned_long,_nullptr>
            ((EqHelper *)local_3f0,"Lexer(\"0x0\"sv).takeU64()","uint64_t(0)",
             (optional<unsigned_long> *)&local_400,local_4a0);
  ::wasm::WATParser::Lexer::~Lexer(&local_458);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_4a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xbc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  local_538 = sv("0x0",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_528,local_538,&local_560);
  oVar3 = ::wasm::WATParser::Lexer::takeI64(&local_528);
  local_4d0._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_4c8 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged;
  local_570[0] = 0;
  testing::internal::EqHelper::Compare<std::optional<unsigned_long>,_unsigned_long,_nullptr>
            ((EqHelper *)local_4c0,"Lexer(\"0x0\"sv).takeI64()","uint64_t(0)",
             (optional<unsigned_long> *)&local_4d0,local_570);
  ::wasm::WATParser::Lexer::~Lexer(&local_528);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_560);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_578);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xbd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  local_600 = sv("+0x0",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_5f0,local_600,&local_628);
  local_593 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_5f0);
  local_591 = std::optional::operator_cast_to_bool((optional *)&local_593);
  local_591 = !local_591;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_590,&local_591,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_5f0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_628);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
  if (!bVar1) {
    testing::Message::Message(local_638);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7.message_,(internal *)local_590,
               (AssertionResult *)"Lexer(\"+0x0\"sv).takeU8()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xbf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_640,local_638);
    testing::internal::AssertHelper::~AssertHelper(&local_640);
    std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
    testing::Message::~Message(local_638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  local_6e0 = sv("+0x0",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_6d0,local_6e0,&local_708);
  local_672 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeI8(&local_6d0);
  local_70a[0] = '\0';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_670,"Lexer(\"+0x0\"sv).takeI8()","uint8_t(0)",
             (optional<unsigned_char> *)&local_672,local_70a);
  ::wasm::WATParser::Lexer::~Lexer(&local_6d0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_708);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar1) {
    testing::Message::Message(&local_718);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_670);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xc0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_718);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  local_7a0 = sv("-0x0",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_790,local_7a0,&local_7c8);
  local_733 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_790);
  local_731 = std::optional::operator_cast_to_bool((optional *)&local_733);
  local_731 = !local_731;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_730,&local_731,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_790);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_7c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
  if (!bVar1) {
    testing::Message::Message(local_7d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_8.message_,(internal *)local_730,
               (AssertionResult *)"Lexer(\"-0x0\"sv).takeU8()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xc2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7e0,local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
    testing::Message::~Message(local_7d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
  local_880 = sv("-0x0",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_870,local_880,&local_8a8);
  local_812 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeI8(&local_870);
  local_8aa[0] = '\0';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_810,"Lexer(\"-0x0\"sv).takeI8()","uint8_t(0)",
             (optional<unsigned_char> *)&local_812,local_8aa);
  ::wasm::WATParser::Lexer::~Lexer(&local_870);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_8a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_810);
  if (!bVar1) {
    testing::Message::Message(&local_8b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_810);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xc3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_8b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_8b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_810);
  local_940 = sv("0x1",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_930,local_940,&local_968);
  local_8d2 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_930);
  local_96a[0] = '\x01';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_8d0,"Lexer(\"0x1\"sv).takeU8()","uint8_t(1)",
             (optional<unsigned_char> *)&local_8d2,local_96a);
  ::wasm::WATParser::Lexer::~Lexer(&local_930);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_968);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d0);
  if (!bVar1) {
    testing::Message::Message(&local_978);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xc5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_978);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d0);
  local_a00 = sv("0x1",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_9f0,local_a00,&local_a28);
  local_992 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeI8(&local_9f0);
  local_a2a[0] = '\x01';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_990,"Lexer(\"0x1\"sv).takeI8()","uint8_t(1)",
             (optional<unsigned_char> *)&local_992,local_a2a);
  ::wasm::WATParser::Lexer::~Lexer(&local_9f0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_a28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_990);
  if (!bVar1) {
    testing::Message::Message(&local_a38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_990);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xc6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_a38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_a38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_990);
  local_ac0 = sv("+0x1",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_ab0,local_ac0,&local_ae8);
  local_a53 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_ab0);
  local_a51 = std::optional::operator_cast_to_bool((optional *)&local_a53);
  local_a51 = !local_a51;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a50,&local_a51,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_ab0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_ae8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a50);
  if (!bVar1) {
    testing::Message::Message(local_af8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_11.message_,(internal *)local_a50,
               (AssertionResult *)"Lexer(\"+0x1\"sv).takeU8()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,200,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b00,local_af8);
    testing::internal::AssertHelper::~AssertHelper(&local_b00);
    std::__cxx11::string::~string((string *)&gtest_ar_11.message_);
    testing::Message::~Message(local_af8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a50);
  local_ba0 = sv("+0x1",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_b90,local_ba0,&local_bc8);
  local_b32 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeI8(&local_b90);
  local_bca[0] = '\x01';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_b30,"Lexer(\"+0x1\"sv).takeI8()","uint8_t(1)",
             (optional<unsigned_char> *)&local_b32,local_bca);
  ::wasm::WATParser::Lexer::~Lexer(&local_b90);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_bc8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b30);
  if (!bVar1) {
    testing::Message::Message(&local_bd8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xc9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_bd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_bd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b30);
  local_c60 = sv("-0x1",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_c50,local_c60,&local_c88);
  local_bf3 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_c50);
  local_bf1 = std::optional::operator_cast_to_bool((optional *)&local_bf3);
  local_bf1 = !local_bf1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_bf0,&local_bf1,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_c50);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_c88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bf0);
  if (!bVar1) {
    testing::Message::Message(local_c98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_12.message_,(internal *)local_bf0,
               (AssertionResult *)"Lexer(\"-0x1\"sv).takeU8()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ca0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xcb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ca0,local_c98);
    testing::internal::AssertHelper::~AssertHelper(&local_ca0);
    std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
    testing::Message::~Message(local_c98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bf0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d40,"-0x1");
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_d30,local_d40,&local_d68);
  local_cd2 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeI8(&local_d30);
  local_d6a[0] = 0xff;
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_cd0,"Lexer(\"-0x1\").takeI8()","uint8_t(-1)",
             (optional<unsigned_char> *)&local_cd2,local_d6a);
  ::wasm::WATParser::Lexer::~Lexer(&local_d30);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_d68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cd0);
  if (!bVar1) {
    testing::Message::Message(&local_d78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xcc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_d78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_d78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cd0);
  local_e00 = sv("0x0010",6);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_df0,local_e00,&local_e28);
  local_d92 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_df0);
  local_e2a[0] = '\x10';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_d90,"Lexer(\"0x0010\"sv).takeU8()","uint8_t(16)",
             (optional<unsigned_char> *)&local_d92,local_e2a);
  ::wasm::WATParser::Lexer::~Lexer(&local_df0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_e28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d90);
  if (!bVar1) {
    testing::Message::Message(&local_e38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xce,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_e38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_e38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d90);
  local_ec0 = sv("0x0010",6);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_eb0,local_ec0,&local_ee8);
  local_e52 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeI8(&local_eb0);
  local_eea[0] = '\x10';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_e50,"Lexer(\"0x0010\"sv).takeI8()","uint8_t(16)",
             (optional<unsigned_char> *)&local_e52,local_eea);
  ::wasm::WATParser::Lexer::~Lexer(&local_eb0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_ee8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e50);
  if (!bVar1) {
    testing::Message::Message(&local_ef8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xcf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_ef8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_ef8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e50);
  local_f80 = sv("+0x0010",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_f70,local_f80,&local_fa8);
  local_f13 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_f70);
  local_f11 = std::optional::operator_cast_to_bool((optional *)&local_f13);
  local_f11 = !local_f11;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f10,&local_f11,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_f70);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_fa8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f10);
  if (!bVar1) {
    testing::Message::Message(local_fb8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_15.message_,(internal *)local_f10,
               (AssertionResult *)"Lexer(\"+0x0010\"sv).takeU8()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xd1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_fc0,local_fb8);
    testing::internal::AssertHelper::~AssertHelper(&local_fc0);
    std::__cxx11::string::~string((string *)&gtest_ar_15.message_);
    testing::Message::~Message(local_fb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f10);
  local_1060 = sv("+0x0010",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1050,local_1060,&local_1088);
  local_ff2 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeI8(&local_1050);
  local_108a[0] = '\x10';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_ff0,"Lexer(\"+0x0010\"sv).takeI8()","uint8_t(16)",
             (optional<unsigned_char> *)&local_ff2,local_108a);
  ::wasm::WATParser::Lexer::~Lexer(&local_1050);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1088);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ff0);
  if (!bVar1) {
    testing::Message::Message(&local_1098);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ff0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xd2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_1098);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_1098);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ff0);
  local_1120 = sv("-0x0010",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1110,local_1120,&local_1148);
  local_10b3 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_1110);
  local_10b1 = std::optional::operator_cast_to_bool((optional *)&local_10b3);
  local_10b1 = !local_10b1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_10b0,&local_10b1,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1110);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10b0);
  if (!bVar1) {
    testing::Message::Message(local_1158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_16.message_,(internal *)local_10b0,
               (AssertionResult *)"Lexer(\"-0x0010\"sv).takeU8()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xd4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1160,local_1158);
    testing::internal::AssertHelper::~AssertHelper(&local_1160);
    std::__cxx11::string::~string((string *)&gtest_ar_16.message_);
    testing::Message::~Message(local_1158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10b0);
  local_1200 = sv("-0x0010",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_11f0,local_1200,&local_1228);
  local_1192 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeI8(&local_11f0);
  local_122a[0] = 0xf0;
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_1190,"Lexer(\"-0x0010\"sv).takeI8()","uint8_t(-16)",
             (optional<unsigned_char> *)&local_1192,local_122a);
  ::wasm::WATParser::Lexer::~Lexer(&local_11f0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1190);
  if (!bVar1) {
    testing::Message::Message(&local_1238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xd5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__6.message_,&local_1238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_1238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1190);
  local_12c0 = sv("0xabcdef",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_12b0,local_12c0,&local_12e8);
  local_1253 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_12b0);
  local_1251 = std::optional::operator_cast_to_bool((optional *)&local_1253);
  local_1251 = !local_1251;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1250,&local_1251,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_12b0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_12e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1250);
  if (!bVar1) {
    testing::Message::Message(local_12f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_17.message_,(internal *)local_1250,
               (AssertionResult *)"Lexer(\"0xabcdef\"sv).takeU8()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xd7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1300,local_12f8);
    testing::internal::AssertHelper::~AssertHelper(&local_1300);
    std::__cxx11::string::~string((string *)&gtest_ar_17.message_);
    testing::Message::~Message(local_12f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1250);
  local_13a0 = sv("0xabcdef",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1390,local_13a0,&local_13c8);
  local_1338 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_1390);
  local_13d0[0] = 0xabcdef;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_1330,"Lexer(\"0xabcdef\"sv).takeU32()","uint32_t(0xabcdef)",
             (optional<unsigned_int> *)&local_1338,local_13d0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1390);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_13c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1330);
  if (!bVar1) {
    testing::Message::Message(&local_13d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xd8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_13d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_13d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1330);
  local_1460 = sv("0xabcdef",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1450,local_1460,&local_1488);
  local_13f8 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_1450);
  local_1490[0] = 0xabcdef;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_13f0,"Lexer(\"0xabcdef\"sv).takeI32()","uint32_t(0xabcdef)",
             (optional<unsigned_int> *)&local_13f8,local_1490);
  ::wasm::WATParser::Lexer::~Lexer(&local_1450);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1488);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13f0);
  if (!bVar1) {
    testing::Message::Message(&local_1498);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_13f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xd9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7.message_,&local_1498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_1498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13f0);
  local_1528 = sv("+0xABCDEF",9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1518,local_1528,&local_1550);
  local_14bc = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_1518);
  local_14b1 = std::optional::operator_cast_to_bool((optional *)&local_14bc);
  local_14b1 = !local_14b1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_14b0,&local_14b1,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1518);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1550);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14b0);
  if (!bVar1) {
    testing::Message::Message(local_1560);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_19.message_,(internal *)local_14b0,
               (AssertionResult *)"Lexer(\"+0xABCDEF\"sv).takeU32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xdb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1568,local_1560);
    testing::internal::AssertHelper::~AssertHelper(&local_1568);
    std::__cxx11::string::~string((string *)&gtest_ar_19.message_);
    testing::Message::~Message(local_1560);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14b0);
  local_1608 = sv("+0xABCDEF",9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_15f8,local_1608,&local_1630);
  local_15a0 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_15f8);
  local_1638[0] = 0xabcdef;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_1598,"Lexer(\"+0xABCDEF\"sv).takeI32()","uint32_t(0xabcdef)",
             (optional<unsigned_int> *)&local_15a0,local_1638);
  ::wasm::WATParser::Lexer::~Lexer(&local_15f8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1630);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1598);
  if (!bVar1) {
    testing::Message::Message(&local_1640);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1598);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xdc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__8.message_,&local_1640);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_1640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1598);
  local_16d0 = sv("-0xAbCdEf",9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_16c0,local_16d0,&local_16f8);
  local_1664 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_16c0);
  local_1659 = std::optional::operator_cast_to_bool((optional *)&local_1664);
  local_1659 = !local_1659;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1658,&local_1659,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_16c0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_16f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1658);
  if (!bVar1) {
    testing::Message::Message(local_1708);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_20.message_,(internal *)local_1658,
               (AssertionResult *)"Lexer(\"-0xAbCdEf\"sv).takeU32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1710,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xde,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1710,local_1708);
    testing::internal::AssertHelper::~AssertHelper(&local_1710);
    std::__cxx11::string::~string((string *)&gtest_ar_20.message_);
    testing::Message::~Message(local_1708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1658);
  local_17b0 = sv("-0xAbCdEf",9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_17a0,local_17b0,&local_17d8);
  local_1748 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_17a0);
  local_17e0[0] = 0xff543211;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_1740,"Lexer(\"-0xAbCdEf\"sv).takeI32()","uint32_t(-0xabcdef)",
             (optional<unsigned_int> *)&local_1748,local_17e0);
  ::wasm::WATParser::Lexer::~Lexer(&local_17a0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_17d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1740);
  if (!bVar1) {
    testing::Message::Message(&local_17e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1740);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xdf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_17e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_17e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1740);
  local_1870 = sv("0x12_34",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1860,local_1870,&local_1898);
  local_1808 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_1860);
  local_18a0[0] = 0x1234;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_1800,"Lexer(\"0x12_34\"sv).takeU32()","uint32_t(0x1234)",
             (optional<unsigned_int> *)&local_1808,local_18a0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1860);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1898);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1800);
  if (!bVar1) {
    testing::Message::Message(&local_18a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1800);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xe1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_18a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_18a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1800);
  local_1930 = sv("0x12_34",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1920,local_1930,&local_1958);
  local_18c8 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_1920);
  local_1960[0] = 0x1234;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_18c0,"Lexer(\"0x12_34\"sv).takeI32()","uint32_t(0x1234)",
             (optional<unsigned_int> *)&local_18c8,local_1960);
  ::wasm::WATParser::Lexer::~Lexer(&local_1920);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1958);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18c0);
  if (!bVar1) {
    testing::Message::Message(&local_1968);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_18c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xe2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_1968);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_1968);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_18c0);
  local_19f0 = sv("0x1_2_3_4",9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_19e0,local_19f0,&local_1a18);
  local_1988 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_19e0);
  local_1a20[0] = 0x1234;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_1980,"Lexer(\"0x1_2_3_4\"sv).takeU32()","uint32_t(0x1234)",
             (optional<unsigned_int> *)&local_1988,local_1a20);
  ::wasm::WATParser::Lexer::~Lexer(&local_19e0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1a18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1980);
  if (!bVar1) {
    testing::Message::Message(&local_1a28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1980);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xe4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_1a28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_1a28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1980);
  local_1ab0 = sv("0x1_2_3_4",9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1aa0,local_1ab0,&local_1ad8);
  local_1a48 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_1aa0);
  local_1ae0[0] = 0x1234;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_1a40,"Lexer(\"0x1_2_3_4\"sv).takeI32()","uint32_t(0x1234)",
             (optional<unsigned_int> *)&local_1a48,local_1ae0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1aa0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1ad8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a40);
  if (!bVar1) {
    testing::Message::Message(&local_1ae8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xe5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__9.message_,&local_1ae8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_1ae8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a40);
  local_1b78 = sv("_0x1234",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1b68,local_1b78,&local_1ba0);
  local_1b0c = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_1b68);
  local_1b01 = std::optional::operator_cast_to_bool((optional *)&local_1b0c);
  local_1b01 = !local_1b01;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b00,&local_1b01,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1b68);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1ba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b00);
  if (!bVar1) {
    testing::Message::Message(local_1bb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_1b00,
               (AssertionResult *)"Lexer(\"_0x1234\"sv).takeU32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1bb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xe7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1bb8,local_1bb0);
    testing::internal::AssertHelper::~AssertHelper(&local_1bb8);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(local_1bb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b00);
  local_1c60 = sv("_0x1234",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1c50,local_1c60,&local_1c88);
  local_1bf4 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_1c50);
  local_1be9 = std::optional::operator_cast_to_bool((optional *)&local_1bf4);
  local_1be9 = !local_1be9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1be8,&local_1be9,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1c50);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1c88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1be8);
  if (!bVar1) {
    testing::Message::Message(local_1c98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_1be8,
               (AssertionResult *)"Lexer(\"_0x1234\"sv).takeI32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1ca0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xe8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1ca0,local_1c98);
    testing::internal::AssertHelper::~AssertHelper(&local_1ca0);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(local_1c98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1be8);
  local_1d48 = sv("0x_1234",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1d38,local_1d48,&local_1d70);
  local_1cdc = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_1d38);
  local_1cd1 = std::optional::operator_cast_to_bool((optional *)&local_1cdc);
  local_1cd1 = !local_1cd1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1cd0,&local_1cd1,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1d38);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1d70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1cd0);
  if (!bVar1) {
    testing::Message::Message(local_1d80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_1cd0,
               (AssertionResult *)"Lexer(\"0x_1234\"sv).takeU32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xea,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d88,local_1d80);
    testing::internal::AssertHelper::~AssertHelper(&local_1d88);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(local_1d80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1cd0);
  local_1e30 = sv("0x_1234",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1e20,local_1e30,&local_1e58);
  local_1dc4 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_1e20);
  local_1db9 = std::optional::operator_cast_to_bool((optional *)&local_1dc4);
  local_1db9 = !local_1db9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1db8,&local_1db9,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1e20);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1e58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1db8);
  if (!bVar1) {
    testing::Message::Message(local_1e68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_1db8,
               (AssertionResult *)"Lexer(\"0x_1234\"sv).takeI32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xeb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e70,local_1e68);
    testing::internal::AssertHelper::~AssertHelper(&local_1e70);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(local_1e68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1db8);
  local_1f18 = sv("0x1234_",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1f08,local_1f18,&local_1f40);
  local_1eac = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_1f08);
  local_1ea1 = std::optional::operator_cast_to_bool((optional *)&local_1eac);
  local_1ea1 = !local_1ea1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1ea0,&local_1ea1,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1f08);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1f40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ea0);
  if (!bVar1) {
    testing::Message::Message(local_1f50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_1ea0,
               (AssertionResult *)"Lexer(\"0x1234_\"sv).takeU32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xed,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f58,local_1f50);
    testing::internal::AssertHelper::~AssertHelper(&local_1f58);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(local_1f50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ea0);
  local_2000 = sv("0x1234_",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1ff0,local_2000,&local_2028);
  local_1f94 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_1ff0);
  local_1f89 = std::optional::operator_cast_to_bool((optional *)&local_1f94);
  local_1f89 = !local_1f89;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f88,&local_1f89,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1ff0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2028);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f88);
  if (!bVar1) {
    testing::Message::Message(local_2038);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_1f88,
               (AssertionResult *)"Lexer(\"0x1234_\"sv).takeI32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2040,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xee,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2040,local_2038);
    testing::internal::AssertHelper::~AssertHelper(&local_2040);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(local_2038);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f88);
  local_20e8 = sv("0x12__34",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_20d8,local_20e8,&local_2110);
  local_207c = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_20d8);
  local_2071 = std::optional::operator_cast_to_bool((optional *)&local_207c);
  local_2071 = !local_2071;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2070,&local_2071,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_20d8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2070);
  if (!bVar1) {
    testing::Message::Message(local_2120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_2070,
               (AssertionResult *)"Lexer(\"0x12__34\"sv).takeU32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xf0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2128,local_2120);
    testing::internal::AssertHelper::~AssertHelper(&local_2128);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(local_2120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2070);
  local_21d0 = sv("0x12__34",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_21c0,local_21d0,&local_21f8);
  local_2164 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_21c0);
  local_2159 = std::optional::operator_cast_to_bool((optional *)&local_2164);
  local_2159 = !local_2159;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2158,&local_2159,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_21c0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_21f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2158);
  if (!bVar1) {
    testing::Message::Message(local_2208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__17.message_,(internal *)local_2158,
               (AssertionResult *)"Lexer(\"0x12__34\"sv).takeI32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xf1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2210,local_2208);
    testing::internal::AssertHelper::~AssertHelper(&local_2210);
    std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
    testing::Message::~Message(local_2208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2158);
  local_22b8 = sv("0xg",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_22a8,local_22b8,&local_22e0);
  local_224c = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_22a8);
  local_2241 = std::optional::operator_cast_to_bool((optional *)&local_224c);
  local_2241 = !local_2241;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2240,&local_2241,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_22a8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_22e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2240);
  if (!bVar1) {
    testing::Message::Message(local_22f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_2240,
               (AssertionResult *)"Lexer(\"0xg\"sv).takeU32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_22f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xf3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_22f8,local_22f0);
    testing::internal::AssertHelper::~AssertHelper(&local_22f8);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(local_22f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2240);
  local_23a0 = sv("0xg",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2390,local_23a0,&local_23c8);
  local_2334 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_2390);
  local_2329 = std::optional::operator_cast_to_bool((optional *)&local_2334);
  local_2329 = !local_2329;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2328,&local_2329,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2390);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_23c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2328);
  if (!bVar1) {
    testing::Message::Message(local_23d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__19.message_,(internal *)local_2328,
               (AssertionResult *)"Lexer(\"0xg\"sv).takeI32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_23e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xf4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_23e0,local_23d8);
    testing::internal::AssertHelper::~AssertHelper(&local_23e0);
    std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
    testing::Message::~Message(local_23d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2328);
  local_2488 = sv("0x120x34",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2478,local_2488,&local_24b0);
  local_241c = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_2478);
  local_2411 = std::optional::operator_cast_to_bool((optional *)&local_241c);
  local_2411 = !local_2411;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2410,&local_2411,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2478);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_24b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2410);
  if (!bVar1) {
    testing::Message::Message(local_24c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__20.message_,(internal *)local_2410,
               (AssertionResult *)"Lexer(\"0x120x34\"sv).takeU32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_24c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xf6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_24c8,local_24c0);
    testing::internal::AssertHelper::~AssertHelper(&local_24c8);
    std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
    testing::Message::~Message(local_24c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2410);
  local_2570 = sv("0x120x34",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2560,local_2570,&local_2598);
  local_2504 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_2560);
  local_24f9 = std::optional::operator_cast_to_bool((optional *)&local_2504);
  local_24f9 = !local_24f9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_24f8,&local_24f9,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2560);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2598);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_24f8);
  if (!bVar1) {
    testing::Message::Message(local_25a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_25d0,(internal *)local_24f8,
               (AssertionResult *)"Lexer(\"0x120x34\"sv).takeI32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_25b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xf7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_25b0,local_25a8);
    testing::internal::AssertHelper::~AssertHelper(&local_25b0);
    std::__cxx11::string::~string((string *)&local_25d0);
    testing::Message::~Message(local_25a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_24f8);
  return;
}

Assistant:

TEST(LexerTest, LexHexInt) {
  EXPECT_EQ(Lexer("0x0"sv).takeU8(), uint8_t(0));
  EXPECT_EQ(Lexer("0x0"sv).takeI8(), uint8_t(0));
  EXPECT_EQ(Lexer("0x0"sv).takeI16(), uint16_t(0));
  EXPECT_EQ(Lexer("0x0"sv).takeU32(), uint32_t(0));
  EXPECT_EQ(Lexer("0x0"sv).takeI32(), uint32_t(0));
  EXPECT_EQ(Lexer("0x0"sv).takeU64(), uint64_t(0));
  EXPECT_EQ(Lexer("0x0"sv).takeI64(), uint64_t(0));

  EXPECT_FALSE(Lexer("+0x0"sv).takeU8());
  EXPECT_EQ(Lexer("+0x0"sv).takeI8(), uint8_t(0));

  EXPECT_FALSE(Lexer("-0x0"sv).takeU8());
  EXPECT_EQ(Lexer("-0x0"sv).takeI8(), uint8_t(0));

  EXPECT_EQ(Lexer("0x1"sv).takeU8(), uint8_t(1));
  EXPECT_EQ(Lexer("0x1"sv).takeI8(), uint8_t(1));

  EXPECT_FALSE(Lexer("+0x1"sv).takeU8());
  EXPECT_EQ(Lexer("+0x1"sv).takeI8(), uint8_t(1));

  EXPECT_FALSE(Lexer("-0x1"sv).takeU8());
  EXPECT_EQ(Lexer("-0x1").takeI8(), uint8_t(-1));

  EXPECT_EQ(Lexer("0x0010"sv).takeU8(), uint8_t(16));
  EXPECT_EQ(Lexer("0x0010"sv).takeI8(), uint8_t(16));

  EXPECT_FALSE(Lexer("+0x0010"sv).takeU8());
  EXPECT_EQ(Lexer("+0x0010"sv).takeI8(), uint8_t(16));

  EXPECT_FALSE(Lexer("-0x0010"sv).takeU8());
  EXPECT_EQ(Lexer("-0x0010"sv).takeI8(), uint8_t(-16));

  EXPECT_FALSE(Lexer("0xabcdef"sv).takeU8());
  EXPECT_EQ(Lexer("0xabcdef"sv).takeU32(), uint32_t(0xabcdef));
  EXPECT_EQ(Lexer("0xabcdef"sv).takeI32(), uint32_t(0xabcdef));

  EXPECT_FALSE(Lexer("+0xABCDEF"sv).takeU32());
  EXPECT_EQ(Lexer("+0xABCDEF"sv).takeI32(), uint32_t(0xabcdef));

  EXPECT_FALSE(Lexer("-0xAbCdEf"sv).takeU32());
  EXPECT_EQ(Lexer("-0xAbCdEf"sv).takeI32(), uint32_t(-0xabcdef));

  EXPECT_EQ(Lexer("0x12_34"sv).takeU32(), uint32_t(0x1234));
  EXPECT_EQ(Lexer("0x12_34"sv).takeI32(), uint32_t(0x1234));

  EXPECT_EQ(Lexer("0x1_2_3_4"sv).takeU32(), uint32_t(0x1234));
  EXPECT_EQ(Lexer("0x1_2_3_4"sv).takeI32(), uint32_t(0x1234));

  EXPECT_FALSE(Lexer("_0x1234"sv).takeU32());
  EXPECT_FALSE(Lexer("_0x1234"sv).takeI32());

  EXPECT_FALSE(Lexer("0x_1234"sv).takeU32());
  EXPECT_FALSE(Lexer("0x_1234"sv).takeI32());

  EXPECT_FALSE(Lexer("0x1234_"sv).takeU32());
  EXPECT_FALSE(Lexer("0x1234_"sv).takeI32());

  EXPECT_FALSE(Lexer("0x12__34"sv).takeU32());
  EXPECT_FALSE(Lexer("0x12__34"sv).takeI32());

  EXPECT_FALSE(Lexer("0xg"sv).takeU32());
  EXPECT_FALSE(Lexer("0xg"sv).takeI32());

  EXPECT_FALSE(Lexer("0x120x34"sv).takeU32());
  EXPECT_FALSE(Lexer("0x120x34"sv).takeI32());
}